

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ccnr.cc
# Opt level: O1

bool __thiscall
CCNR::ls_solver::local_search(ls_solver *this,vector<char,_std::allocator<char>_> *init_solution)

{
  int *piVar1;
  pointer piVar2;
  pointer piVar3;
  int *piVar4;
  bool bVar5;
  int flipv;
  int *piVar6;
  ulong uVar7;
  long lVar8;
  allocator_type local_3d;
  value_type_conflict1 local_3c;
  vector<int,_std::allocator<int>_> local_38;
  
  Mersenne::seed(&this->_random_gen,this->_random_seed);
  this->_best_found_cost = this->_num_clauses;
  this->_best_cost_time = 0.0;
  local_3c = 0;
  std::vector<int,_std::allocator<int>_>::vector(&local_38,this->_num_vars + 10,&local_3c,&local_3d)
  ;
  piVar2 = (this->conflict_ct).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  (this->conflict_ct).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start;
  (this->conflict_ct).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_finish;
  (this->conflict_ct).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  if (piVar2 != (pointer)0x0) {
    operator_delete(piVar2);
  }
  if (local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  initialize(this,init_solution);
  piVar2 = (this->_unsat_clauses).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  piVar3 = (this->_unsat_clauses).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  this->_init_unsat_nums = (int)((ulong)((long)piVar2 - (long)piVar3) >> 2);
  if (piVar2 == piVar3) {
LAB_0012ccc1:
    bVar5 = true;
  }
  else {
    this->_step = 0;
    bVar5 = 0 < this->_max_steps;
    if (0 < this->_max_steps) {
      do {
        if (this->_max_mems < this->_mems) {
          return false;
        }
        flipv = pick_var(this);
        flip(this,flipv);
        piVar6 = (this->_unsat_vars).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar4 = (this->_unsat_vars).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        if (piVar6 != piVar4) {
          piVar2 = (this->conflict_ct).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          do {
            piVar1 = piVar2 + *piVar6;
            *piVar1 = *piVar1 + 1;
            piVar6 = piVar6 + 1;
          } while (piVar6 != piVar4);
        }
        uVar7 = (long)(this->_unsat_clauses).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(this->_unsat_clauses).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start >> 2;
        if ((uVar7 < this->_best_found_cost) &&
           (this->_best_found_cost = uVar7, this->_num_vars != 0xffffffffffffffff)) {
          uVar7 = 0;
          do {
            (this->_best_solution).super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start[uVar7] =
                 (this->_solution).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar7];
            uVar7 = uVar7 + 1;
          } while (uVar7 < this->_num_vars + 1);
        }
        if ((this->_unsat_clauses).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            (this->_unsat_clauses).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start) goto LAB_0012ccc1;
        lVar8 = this->_step + 1;
        this->_step = lVar8;
        bVar5 = lVar8 < this->_max_steps;
      } while (lVar8 < this->_max_steps);
    }
  }
  return bVar5;
}

Assistant:

bool ls_solver::local_search(const vector<char> *init_solution)
{
    bool result = false;
    int flipv;
    _random_gen.seed(_random_seed);
    _best_found_cost = _num_clauses;
    _best_cost_time = 0;
    conflict_ct = vector<int>(_num_vars + 10, 0);
    // for(int t=0; t < _max_tries; t++)
    // {
    initialize(init_solution);
    // cout<<"start ls"<<endl;
    _init_unsat_nums = _unsat_clauses.size();
    if (0 == _unsat_clauses.size()) {
        return true;
    } // 1
    for (_step = 0; _step < _max_steps; _step++) {
        if (_mems > _max_mems) {
            // std::cout << "c local search timeout with step "<< _step<< std::endl;
            return result;
        }
        flipv = pick_var();
        flip(flipv);
        for (int var_idx : _unsat_vars) ++conflict_ct[var_idx];
        if (_unsat_clauses.size() < _best_found_cost) {
            _best_found_cost = _unsat_clauses.size();
            for (size_t k = 0; k < _num_vars + 1; ++k) {
                _best_solution[k] = _solution[k];
            }
            // _best_cost_time = get_runtime();
        }
        if (0 == _unsat_clauses.size()) {
            result = true;
            break;
        } // 1
        // if (get_runtime() > _time_limit) {result = false;break;} //0
    }
    // if (0 == _unsat_clauses.size()) {result = true;}//1
    // if (get_runtime() > _time_limit) {result = false;break;}//0
    // }
    // _end_step = _step;
    return result;
}